

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O2

void getata(int m,int n,int_t nz,int_t *colptr,int_t *rowind,int_t *atanz,int_t **ata_colptr,
           int_t **ata_rowind)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int_t *piVar4;
  void *addr;
  undefined4 *addr_00;
  void *addr_01;
  ulong uVar5;
  ulong uVar6;
  int_t *piVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char msg [256];
  char local_138 [264];
  
  iVar8 = n;
  if (n < m) {
    iVar8 = m;
  }
  addr = superlu_malloc((long)iVar8 * 4 + 4);
  if (addr == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xa2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_00 = (undefined4 *)superlu_malloc((long)m * 4 + 4);
  if (addr_00 == (undefined4 *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xa4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  addr_01 = superlu_malloc((long)nz << 2);
  if (addr_01 != (void *)0x0) {
    uVar5 = 0;
    uVar6 = (ulong)(uint)m;
    if (m < 1) {
      uVar6 = uVar5;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      *(undefined4 *)((long)addr + uVar5 * 4) = 0;
    }
    uVar5 = 0;
    uVar10 = 0;
    if (0 < n) {
      uVar10 = (ulong)(uint)n;
    }
    while (uVar5 != uVar10) {
      piVar1 = colptr + uVar5;
      uVar5 = uVar5 + 1;
      for (lVar9 = (long)*piVar1; lVar9 < colptr[uVar5]; lVar9 = lVar9 + 1) {
        piVar1 = (int *)((long)addr + (long)rowind[lVar9] * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    *addr_00 = 0;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      addr_00[uVar5 + 1] = *(int *)((long)addr + uVar5 * 4) + addr_00[uVar5];
      *(undefined4 *)((long)addr + uVar5 * 4) = addr_00[uVar5];
    }
    uVar6 = 0;
    while (uVar5 = uVar6, uVar5 != uVar10) {
      for (lVar9 = (long)colptr[uVar5]; uVar6 = uVar5 + 1, lVar9 < colptr[uVar5 + 1];
          lVar9 = lVar9 + 1) {
        iVar8 = rowind[lVar9];
        *(int *)((long)addr_01 + (long)*(int *)((long)addr + (long)iVar8 * 4) * 4) = (int)uVar5;
        piVar1 = (int *)((long)addr + (long)iVar8 * 4);
        *piVar1 = *piVar1 + 1;
      }
    }
    for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
      *(undefined4 *)((long)addr + uVar6 * 4) = 0xffffffff;
    }
    iVar8 = 0;
    uVar6 = 0;
    while (uVar5 = uVar6, uVar5 != uVar10) {
      *(int *)((long)addr + uVar5 * 4) = (int)uVar5;
      for (lVar9 = (long)colptr[uVar5]; uVar6 = uVar5 + 1, lVar9 < colptr[uVar5 + 1];
          lVar9 = lVar9 + 1) {
        iVar2 = rowind[lVar9];
        for (lVar11 = (long)(int)addr_00[iVar2]; lVar11 < (int)addr_00[(long)iVar2 + 1];
            lVar11 = lVar11 + 1) {
          lVar12 = (long)*(int *)((long)addr_01 + lVar11 * 4);
          if (uVar5 != *(uint *)((long)addr + lVar12 * 4)) {
            *(int *)((long)addr + lVar12 * 4) = (int)uVar5;
            iVar8 = iVar8 + 1;
          }
        }
      }
    }
    *atanz = iVar8;
    piVar7 = (int_t *)superlu_malloc((long)n * 4 + 4);
    *ata_colptr = piVar7;
    if (piVar7 != (int_t *)0x0) {
      if ((long)*atanz != 0) {
        piVar7 = (int_t *)superlu_malloc((long)*atanz << 2);
        *ata_rowind = piVar7;
        if (piVar7 == (int_t *)0x0) {
          sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_rowind[]",
                  0xe7,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
                 );
          superlu_abort_and_exit(local_138);
        }
      }
      piVar7 = *ata_colptr;
      piVar4 = *ata_rowind;
      for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
        *(undefined4 *)((long)addr + uVar6 * 4) = 0xffffffff;
      }
      iVar8 = 0;
      uVar6 = 0;
      while (uVar5 = uVar6, uVar5 != uVar10) {
        piVar7[uVar5] = iVar8;
        *(int *)((long)addr + uVar5 * 4) = (int)uVar5;
        for (lVar9 = (long)colptr[uVar5]; uVar6 = uVar5 + 1, lVar9 < colptr[uVar5 + 1];
            lVar9 = lVar9 + 1) {
          iVar2 = rowind[lVar9];
          for (lVar11 = (long)(int)addr_00[iVar2]; lVar11 < (int)addr_00[(long)iVar2 + 1];
              lVar11 = lVar11 + 1) {
            iVar3 = *(int *)((long)addr_01 + lVar11 * 4);
            if (uVar5 != *(uint *)((long)addr + (long)iVar3 * 4)) {
              *(int *)((long)addr + (long)iVar3 * 4) = (int)uVar5;
              lVar12 = (long)iVar8;
              iVar8 = iVar8 + 1;
              piVar4[lVar12] = iVar3;
            }
          }
        }
      }
      piVar7[n] = iVar8;
      superlu_free(addr);
      superlu_free(addr_00);
      superlu_free(addr_01);
      return;
    }
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_colptr[]",0xe4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(local_138);
  }
  sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xa6,
          "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c");
  superlu_abort_and_exit(local_138);
}

Assistant:

void getata(const int m, const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
            int_t *atanz, int_t **ata_colptr, int_t **ata_rowind)
{
    register int_t i, j, k, col, num_nz, ti, trow;
    int_t *marker, *b_colptr, *b_rowind;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */

    if ( !(marker = (int_t*) SUPERLU_MALLOC((SUPERLU_MAX(m,n)+1)*sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC((m+1) * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC(nz * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < m; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < m; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}

    
    /* ----------------------------------------------------------------
       compute B = T * A, where column j of B is:

       Struct (B_*j) =    UNION   ( Struct (T_*k) )
                        A_kj != 0

       do not include the diagonal entry
   
       ( Partition A as: A = (A_*1, ..., A_*n)
         Then B = T * A = (T * A_*1, ..., T * A_*n), where
         T * A_*j = (T_*1, ..., T_*m) * A_*j.  )
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    num_nz++;
		}
	    }
	}
    }
    *atanz = num_nz;
    
    /* Allocate storage for A'*A */
    if ( !(*ata_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for ata_colptr[]");
    if ( *atanz ) {
	if ( !(*ata_rowind = (int_t*) SUPERLU_MALLOC( *atanz * sizeof(int_t)) ) )
	    ABORT("SUPERLU_MALLOC fails for ata_rowind[]");
    }
    b_colptr = *ata_colptr; /* aliasing */
    b_rowind = *ata_rowind;
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	b_colptr[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    b_rowind[num_nz++] = trow;
		}
	    }
	}
    }
    b_colptr[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}